

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLeSample * __thiscall
pbrt::UniformInfiniteLight::SampleLe
          (UniformInfiniteLight *this,Point2f *u1,Point2f *u2,SampledWavelengths *lambda,Float time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long in_RSI;
  LightLeSample *in_RDI;
  SampledWavelengths *lambda_00;
  undefined8 uVar12;
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Vector3f VVar17;
  Vector3<float> VVar18;
  Point3<float> PVar19;
  SampledSpectrum SVar20;
  Float pdfDir;
  Float pdfPos;
  Ray ray;
  Point3f pDisk;
  Point2f cd;
  Frame wFrame;
  Vector3f w;
  Float in_stack_fffffffffffffdb8;
  Float in_stack_fffffffffffffdbc;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffdc0;
  Ray *ray_00;
  SampledSpectrum *L;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffffde4;
  float s;
  Point2f *in_stack_fffffffffffffdf8;
  Vector3f *in_stack_fffffffffffffe58;
  Frame *in_stack_fffffffffffffe60;
  undefined1 local_cc [20];
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined1 local_6c [44];
  float local_40;
  undefined8 local_38;
  float local_30;
  undefined4 local_2c;
  undefined1 extraout_var [56];
  undefined1 auVar16 [56];
  
  auVar13 = in_ZMM0._8_56_;
  local_2c = in_ZMM0._0_4_;
  VVar17 = SampleUniformSphere((Point2f *)
                               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  local_40 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar13;
  local_6c._36_8_ = vmovlpd_avx(auVar3._0_16_);
  local_38 = local_6c._36_8_;
  local_30 = local_40;
  VVar18 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffdc0);
  local_80 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar13;
  local_88 = vmovlpd_avx(auVar4._0_16_);
  ray_00 = (Ray *)local_6c;
  local_78 = local_88;
  local_70 = local_80;
  Frame::FromZ((Vector3f *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  auVar5._0_8_ = SampleUniformDiskConcentric(in_stack_fffffffffffffdf8);
  auVar5._8_56_ = extraout_var;
  local_90 = vmovlpd_avx(auVar5._0_16_);
  uVar21 = *(undefined4 *)(in_RSI + 0xd0);
  uVar12 = 0;
  L = (SampledSpectrum *)local_cc;
  Vector3<float>::Vector3
            ((Vector3<float> *)ray_00,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8,0.0);
  VVar17 = Frame::FromLocal(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_b8 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  lambda_00 = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13 = (undefined1  [56])0x0;
  uVar22 = (undefined4)uVar12;
  s = (float)((ulong)uVar12 >> 0x20);
  auVar1._8_4_ = uVar22;
  auVar1._0_8_ = lambda_00;
  auVar1._12_4_ = s;
  local_cc._12_8_ = vmovlpd_avx(auVar1);
  VVar18 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)lambda_00);
  local_a8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar13;
  local_b0 = vmovlpd_avx(auVar6._0_16_);
  PVar19 = Point3<float>::operator+
                     ((Point3<float> *)CONCAT44(uVar21,in_stack_fffffffffffffdd0),
                      (Vector3<float> *)L);
  local_98 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar13;
  local_a0 = vmovlpd_avx(auVar7._0_16_);
  uVar12 = 0;
  VVar18 = Tuple3<pbrt::Vector3,_float>::operator-((Tuple3<pbrt::Vector3,_float> *)ray_00);
  auVar13 = (undefined1  [56])0x0;
  auVar2._8_8_ = uVar12;
  auVar2._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  vmovlpd_avx(auVar2);
  VVar18 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)lambda_00);
  auVar8._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  vmovlpd_avx(auVar8._0_16_);
  PVar19 = Point3<float>::operator+
                     ((Point3<float> *)CONCAT44(uVar21,in_stack_fffffffffffffdd0),
                      (Vector3<float> *)L);
  auVar9._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  vmovlpd_avx(auVar9._0_16_);
  MediumHandle::TaggedPointer
            ((MediumHandle *)ray_00,
             (nullptr_t)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  Ray::Ray((Ray *)CONCAT44(s,uVar22),(Point3f *)lambda_00,
           (Vector3f *)CONCAT44(uVar21,in_stack_fffffffffffffdd0),(Float)((ulong)L >> 0x20),
           (MediumHandle *)ray_00);
  Sqr<float>(*(float *)(in_RSI + 0xd0));
  auVar16 = (undefined1  [56])0x0;
  UniformSpherePDF();
  auVar13 = (undefined1  [56])0x0;
  SVar20 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)CONCAT44(s,uVar22),lambda_00);
  auVar14._0_8_ = SVar20.values.values._8_8_;
  auVar14._8_56_ = auVar16;
  auVar10._0_8_ = SVar20.values.values._0_8_;
  auVar10._8_56_ = auVar13;
  auVar13 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar10._0_16_);
  vmovlpd_avx(auVar14._0_16_);
  SVar20 = pbrt::operator*((Float)((ulong)ray_00 >> 0x20),
                           (SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  auVar15._0_8_ = SVar20.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar11._0_8_ = SVar20.values.values._0_8_;
  auVar11._8_56_ = auVar13;
  vmovlpd_avx(auVar11._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  LightLeSample::LightLeSample
            ((LightLeSample *)CONCAT44(uVar21,in_stack_fffffffffffffdd0),L,ray_00,
             in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
  return in_RDI;
}

Assistant:

LightLeSample UniformInfiniteLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                             SampledWavelengths &lambda,
                                             Float time) const {
    Vector3f w = SampleUniformSphere(u1);
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute probabilities for uniform infinite light
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
    Float pdfDir = UniformSpherePDF();

    return LightLeSample(scale * Lemit.Sample(lambda), ray, pdfPos, pdfDir);
}